

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall Logger::Logger(Logger *this)

{
  this->l_buf = (char *)0x0;
  this->l_inited = false;
  this->l_buffer_queue =
       (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  this->l_is_stdout = false;
  this->is_thread_stop = (__atomic_base<bool>)0x0;
  (this->l_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->l_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->l_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->l_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->l_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->l_asyncw_thread = (thread *)0x0;
  if (2 < pr_level) {
    printf("[%-5s][%s:%d] log class constructed\n","debug","Logger",0x29);
  }
  this->l_count = 0;
  return;
}

Assistant:

Logger::Logger()
{
    PR_DEBUG("log class constructed\n");
    l_count = 0;
}